

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMap.cpp
# Opt level: O3

Var Js::JavascriptMap::EntryForEach(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  undefined8 uVar1;
  ThreadContext *this;
  code *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  JavascriptMap *pJVar7;
  RecyclableObject *pRVar8;
  JavascriptMethod p_Var9;
  int in_stack_00000010;
  undefined1 local_b0 [8];
  AutoTagNativeLibraryEntry __tag;
  CallInfo callInfo_local;
  undefined1 local_78 [8];
  ArgumentReader args;
  Iterator iterator;
  undefined8 local_48;
  ScriptContext *local_40;
  bool local_31;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  __tag.entry.next = (Entry *)callInfo;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptMap.cpp"
                                ,0x9a,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_78 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_78,(CallInfo *)&__tag.entry.next);
  local_40 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
             scriptContext.ptr;
  AutoTagNativeLibraryEntry::AutoTagNativeLibraryEntry
            ((AutoTagNativeLibraryEntry *)local_b0,function,(CallInfo)__tag.entry.next,
             L"Map.prototype.forEach",&stack0x00000000);
  pvVar6 = Arguments::operator[]((Arguments *)local_78,0);
  bVar4 = VarIs<Js::JavascriptMap>(pvVar6);
  if (bVar4) {
    pJVar7 = UnsafeVarTo<Js::JavascriptMap>(pvVar6);
    if (pJVar7 != (JavascriptMap *)0x0) {
      if (((ulong)local_78 & 0xfffffe) != 0) {
        pvVar6 = Arguments::operator[]((Arguments *)local_78,1);
        bVar4 = JavascriptConversion::IsCallable(pvVar6);
        if (bVar4) {
          pvVar6 = Arguments::operator[]((Arguments *)local_78,1);
          pRVar8 = VarTo<Js::RecyclableObject>(pvVar6);
          if ((local_78._0_4_ & 0xffffff) < 3) {
            iterator.current.ptr =
                 (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                  *)(((local_40->super_ScriptContextBase).javascriptLibrary)->
                    super_JavascriptLibraryBase).undefinedValue.ptr;
          }
          else {
            iterator.current.ptr =
                 (MapOrSetDataNode<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                  *)Arguments::operator[]((Arguments *)local_78,2);
          }
          Memory::Recycler::WBSetBit((char *)&args.super_Arguments.Values);
          args.super_Arguments.Values = (Type)&pJVar7->list;
          Memory::RecyclerWriteBarrierManager::WriteBarrier(&args.super_Arguments.Values);
          while( true ) {
            bVar4 = MapOrSetDataList<JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>_>
                    ::Iterator::Next((Iterator *)&args.super_Arguments.Values);
            if (!bVar4) {
              pRVar8 = (((local_40->super_ScriptContextBase).javascriptLibrary)->
                       super_JavascriptLibraryBase).undefinedValue.ptr;
              AutoTagNativeLibraryEntry::~AutoTagNativeLibraryEntry
                        ((AutoTagNativeLibraryEntry *)local_b0);
              return pRVar8;
            }
            uVar1 = _DAT_00000010;
            Memory::Recycler::WBSetBit((char *)&local_48);
            local_48 = uVar1;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
            uVar3 = local_48;
            uVar1 = _DAT_00000018;
            Memory::Recycler::WBSetBit((char *)&local_48);
            local_48 = uVar1;
            Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_48);
            uVar1 = local_48;
            this = local_40->threadContext;
            local_31 = this->reentrancySafeOrHandled;
            this->reentrancySafeOrHandled = true;
            ThreadContext::CheckAndResetReentrancySafeOrHandled(this);
            if (local_40->threadContext->noJsReentrancy == true) break;
            p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
            CheckIsExecutable(pRVar8,p_Var9);
            p_Var9 = RecyclableObject::GetEntryPoint(pRVar8);
            (*p_Var9)(pRVar8,(CallInfo)pRVar8,0x2000004,0,0,0,0,0x2000004,iterator.current.ptr,uVar1
                      ,uVar3,pJVar7);
            this->reentrancySafeOrHandled = local_31;
          }
          Throw::FatalJsReentrancyError();
        }
      }
      JavascriptError::ThrowTypeError(local_40,-0x7ff5ec34,L"Map.prototype.forEach");
    }
  }
  JavascriptError::ThrowTypeErrorVar(local_40,-0x7ff5ec04,L"Map.prototype.forEach",L"Map");
}

Assistant:

Var JavascriptMap::EntryForEach(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();
    AUTO_TAG_NATIVE_LIBRARY_ENTRY(function, callInfo, _u("Map.prototype.forEach"));

    JavascriptMap* map = JavascriptOperators::TryFromVar<JavascriptMap>(args[0]);
    if (map == nullptr)
    {
        JavascriptError::ThrowTypeErrorVar(scriptContext, JSERR_NeedObjectOfType, _u("Map.prototype.forEach"), _u("Map"));
    }

    if (args.Info.Count < 2 || !JavascriptConversion::IsCallable(args[1]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_FunctionArgument_NeedFunction, _u("Map.prototype.forEach"));
    }
    RecyclableObject* callBackFn = VarTo<RecyclableObject>(args[1]);

    Var thisArg = (args.Info.Count > 2) ? args[2] : scriptContext->GetLibrary()->GetUndefined();

    auto iterator = map->GetIterator();

    while (iterator.Next())
    {
        Var key = iterator.Current().Key();
        Var value = iterator.Current().Value();

        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            CALL_FUNCTION(scriptContext->GetThreadContext(), callBackFn, CallInfo(CallFlags_Value, 4), thisArg, value, key, map);
        }
        END_SAFE_REENTRANT_CALL
    }

    return scriptContext->GetLibrary()->GetUndefined();
}